

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertWeakNode
          (CollationBuilder *this,int32_t index,uint32_t weight16,int32_t level,
          UErrorCode *errorCode)

{
  int iVar1;
  int32_t iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (weight16 == 0x500) {
    iVar2 = findCommonNode(this,index,level);
    return iVar2;
  }
  iVar1 = (this->nodes).count;
  if (index < iVar1 && -1 < index) {
    uVar4 = (this->nodes).elements[(uint)index];
  }
  else {
    uVar4 = 0;
  }
  if (weight16 - 1 < 0x4ff) {
    uVar6 = (ulong)(level == 1) * 0x20 + 0x20;
    if (((uint)uVar4 & (uint)uVar6) == 0) {
      uVar3 = (ulong)((uint)uVar4 & 0x20);
      uVar8 = uVar4 & 0xffffffffffffffdf;
      if (level != 1) {
        uVar8 = uVar4;
        uVar3 = 0;
      }
      UVector64::setElementAt(&this->nodes,uVar6 | uVar8,index);
      uVar5 = (uint)(uVar8 >> 8) & 0xfffff;
      iVar2 = insertNodeBetween(this,index,uVar5,(ulong)weight16 << 0x30 | (long)level,errorCode);
      insertNodeBetween(this,iVar2,uVar5,(long)level | 0x500000000000000U | uVar3,errorCode);
      return iVar2;
    }
  }
  uVar6 = (ulong)(uint)index;
  do {
    do {
      do {
        uVar3 = uVar6;
        uVar5 = (uint)(uVar4 >> 8) & 0xfffff;
        uVar6 = (ulong)uVar5;
        if ((uVar4 >> 8 & 0xfffff) == 0) goto LAB_0022efc2;
        if ((int)uVar5 < iVar1) {
          uVar4 = (this->nodes).elements[uVar5];
        }
        else {
          uVar4 = 0;
        }
        uVar7 = (uint)uVar4 & 3;
      } while (level < (int)uVar7);
      if (uVar7 < (uint)level) goto LAB_0022efc2;
    } while ((uVar4 & 8) != 0);
    uVar7 = (uint)(ushort)(uVar4 >> 0x30);
    if (uVar7 == weight16) {
      return uVar5;
    }
  } while (uVar7 <= weight16);
LAB_0022efc2:
  iVar2 = insertNodeBetween(this,(int32_t)uVar3,uVar5,(long)level | (ulong)weight16 << 0x30,
                            errorCode);
  return iVar2;
}

Assistant:

int32_t
CollationBuilder::findOrInsertWeakNode(int32_t index, uint32_t weight16, int32_t level, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(0 <= index && index < nodes.size());
    U_ASSERT(UCOL_SECONDARY <= level && level <= UCOL_TERTIARY);

    if(weight16 == Collation::COMMON_WEIGHT16) {
        return findCommonNode(index, level);
    }

    // If this will be the first below-common weight for the parent node,
    // then we will also need to insert a common weight after it.
    int64_t node = nodes.elementAti(index);
    U_ASSERT(strengthFromNode(node) < level);  // parent node is stronger
    if(weight16 != 0 && weight16 < Collation::COMMON_WEIGHT16) {
        int32_t hasThisLevelBefore = level == UCOL_SECONDARY ? HAS_BEFORE2 : HAS_BEFORE3;
        if((node & hasThisLevelBefore) == 0) {
            // The parent node has an implied level-common weight.
            int64_t commonNode =
                nodeFromWeight16(Collation::COMMON_WEIGHT16) | nodeFromStrength(level);
            if(level == UCOL_SECONDARY) {
                // Move the HAS_BEFORE3 flag from the parent node
                // to the new secondary common node.
                commonNode |= node & HAS_BEFORE3;
                node &= ~(int64_t)HAS_BEFORE3;
            }
            nodes.setElementAt(node | hasThisLevelBefore, index);
            // Insert below-common-weight node.
            int32_t nextIndex = nextIndexFromNode(node);
            node = nodeFromWeight16(weight16) | nodeFromStrength(level);
            index = insertNodeBetween(index, nextIndex, node, errorCode);
            // Insert common-weight node.
            insertNodeBetween(index, nextIndex, commonNode, errorCode);
            // Return index of below-common-weight node.
            return index;
        }
    }

    // Find the root CE's weight for this level.
    // Postpone insertion if not found:
    // Insert the new root node before the next stronger node,
    // or before the next root node with the same strength and a larger weight.
    int32_t nextIndex;
    while((nextIndex = nextIndexFromNode(node)) != 0) {
        node = nodes.elementAti(nextIndex);
        int32_t nextStrength = strengthFromNode(node);
        if(nextStrength <= level) {
            // Insert before a stronger node.
            if(nextStrength < level) { break; }
            // nextStrength == level
            if(!isTailoredNode(node)) {
                uint32_t nextWeight16 = weight16FromNode(node);
                if(nextWeight16 == weight16) {
                    // Found the node for the root CE up to this level.
                    return nextIndex;
                }
                // Insert before a node with a larger same-strength weight.
                if(nextWeight16 > weight16) { break; }
            }
        }
        // Skip the next node.
        index = nextIndex;
    }
    node = nodeFromWeight16(weight16) | nodeFromStrength(level);
    return insertNodeBetween(index, nextIndex, node, errorCode);
}